

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.hpp
# Opt level: O1

void __thiscall
beast::unit_test::suite::log_buf<char,_std::char_traits<char>,_std::allocator<char>_>::~log_buf
          (log_buf<char,_std::char_traits<char>,_std::allocator<char>_> *this)

{
  *(undefined ***)this = &PTR__log_buf_002d6b98;
  sync(this);
  *(undefined8 *)this = 0x2d5db8;
  if (*(undefined1 **)&this->field_0x48 != &this->field_0x58) {
    operator_delete(*(undefined1 **)&this->field_0x48,*(long *)&this->field_0x58 + 1);
  }
  *(undefined8 *)this = 0x2d5fd8;
  ::std::locale::~locale((locale *)&this->field_0x38);
  return;
}

Assistant:

~log_buf()
        {
            sync();
        }